

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O1

bool check_for_option(int argc,char **argv,char *pOption)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  
  bVar4 = 1 < argc;
  if (1 < argc) {
    uVar3 = 2;
    do {
      if (((byte)(*argv[uVar3 - 1] | 2U) == 0x2f) &&
         (iVar1 = crnlib::crn_stricmp(argv[uVar3 - 1] + 1,pOption), iVar1 == 0)) {
        return bVar4;
      }
      bVar4 = uVar3 < (uint)argc;
      lVar2 = uVar3 + (2 - (ulong)(uint)argc);
      uVar3 = uVar3 + 1;
    } while (lVar2 != 2);
  }
  return bVar4;
}

Assistant:

static bool check_for_option(int argc, char* argv[], const char* pOption)
{
    for (int i = 1; i < argc; i++)
    {
        if ((argv[i][0] == '/') || (argv[i][0] == '-'))
        {
            if (crn_stricmp(&argv[i][1], pOption) == 0)
                return true;
        }
    }
    return false;
}